

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ActivationLinear *pAVar3;
  bool bVar4;
  LogMessage *other;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  size_type *psVar8;
  ActivationLinear *pAVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  Result *_result;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  uint uVar15;
  undefined1 *puVar16;
  uint uVar17;
  uint uVar18;
  ActivationLinear *__val;
  string err_1;
  string __str;
  string err;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [56];
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argsort","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x5b5) {
    puVar16 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar16 = Specification::_ArgSortLayerParams_default_instance_;
  }
  if ((long)(((ActivationParams *)puVar16)->NonlinearityType_).linear_ < 0) {
    std::operator+(&local_170,
                   "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_88._16_8_ = *psVar8;
      local_88._24_8_ = plVar5[3];
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_88 + 0x10);
    }
    else {
      local_88._16_8_ = *psVar8;
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_88._8_8_ = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    uVar13 = local_88._16_8_;
    _Var14._M_p = (pointer)local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_88 + 0x10)) {
      return __return_storage_ptr__;
    }
LAB_00373e3f:
    operator_delete(_Var14._M_p,uVar13 + 1);
  }
  else {
    if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        other = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,other);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      local_f0 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                      elements[0] + 0x24);
      if (((long)(((ActivationParams *)puVar16)->NonlinearityType_).linear_ < 0) ||
         (local_f0 <= (long)(((ActivationParams *)puVar16)->NonlinearityType_).linear_)) {
        pAVar3 = (((ActivationParams *)puVar16)->NonlinearityType_).linear_;
        __val = (ActivationLinear *)-(long)pAVar3;
        if (0 < (long)pAVar3) {
          __val = pAVar3;
        }
        uVar17 = 1;
        if ((ActivationLinear *)0x9 < __val) {
          pAVar9 = __val;
          uVar15 = 4;
          do {
            uVar17 = uVar15;
            if (pAVar9 < (ActivationLinear *)0x64) {
              uVar17 = uVar17 - 2;
              goto LAB_003739ee;
            }
            if (pAVar9 < (ActivationLinear *)0x3e8) {
              uVar17 = uVar17 - 1;
              goto LAB_003739ee;
            }
            if (pAVar9 < (ActivationLinear *)0x2710) goto LAB_003739ee;
            bVar4 = (ActivationLinear *)0x1869f < pAVar9;
            pAVar9 = (ActivationLinear *)((ulong)pAVar9 / 10000);
            uVar15 = uVar17 + 4;
          } while (bVar4);
          uVar17 = uVar17 + 1;
        }
LAB_003739ee:
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_e8,(char)uVar17 - (char)((long)pAVar3 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_e8[0] - ((long)pAVar3 >> 0x3f)),uVar17,(unsigned_long)__val)
        ;
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x3e46fb);
        local_110 = &local_100;
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar5[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar5;
        }
        local_108 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_190 = &local_180;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar11) {
          local_180 = *puVar11;
          lStack_178 = plVar5[3];
        }
        else {
          local_180 = *puVar11;
          local_190 = (ulong *)*plVar5;
        }
        local_188 = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        uVar17 = -(uint)local_f0;
        if (0 < (int)(uint)local_f0) {
          uVar17 = (uint)local_f0;
        }
        uVar15 = 1;
        if (9 < uVar17) {
          uVar12 = (ulong)uVar17;
          uVar18 = 4;
          do {
            uVar15 = uVar18;
            uVar7 = (uint)uVar12;
            if (uVar7 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_00373b4d;
            }
            if (uVar7 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_00373b4d;
            }
            if (uVar7 < 10000) goto LAB_00373b4d;
            uVar12 = uVar12 / 10000;
            uVar18 = uVar15 + 4;
          } while (99999 < uVar7);
          uVar15 = uVar15 + 1;
        }
LAB_00373b4d:
        uVar18 = (uint)local_f0 >> 0x1f;
        local_130 = local_120;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_130,(char)uVar15 - ((char)((ulong)local_f0 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar18 + (long)local_130),uVar15,uVar17);
        uVar12 = 0xf;
        if (local_190 != &local_180) {
          uVar12 = local_180;
        }
        if (uVar12 < (ulong)(local_128 + local_188)) {
          uVar12 = 0xf;
          if (local_130 != local_120) {
            uVar12 = local_120[0];
          }
          if (uVar12 < (ulong)(local_128 + local_188)) goto LAB_00373bc1;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_190);
        }
        else {
LAB_00373bc1:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
        }
        local_150 = &local_140;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_140 = *plVar5;
          uStack_138 = puVar6[3];
        }
        else {
          local_140 = *plVar5;
          local_150 = (long *)*puVar6;
        }
        local_148 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_b8 = *plVar10;
          lStack_b0 = plVar5[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar10;
          local_c8 = (long *)*plVar5;
        }
        local_c0 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c8,
                                    *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ &
                                              0xfffffffffffffffe));
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_98 = *plVar10;
          lStack_90 = plVar5[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar10;
          local_a8 = (long *)*plVar5;
        }
        local_a0 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170.field_2._8_8_ = plVar5[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_170._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_130 != local_120) {
          operator_delete(local_130,local_120[0] + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
        uVar13 = local_170.field_2._M_allocated_capacity;
        _Var14._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == &local_170.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_00373e3f;
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Argsort", blobNameToRank));

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}